

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X11MiniFB.c
# Opt level: O0

void processEvent(SWindowData *window_data,XEvent *event)

{
  mfb_mouse_button mVar1;
  int iVar2;
  mfb_key mVar3;
  uint32_t uVar4;
  int *in_RSI;
  SWindowData *in_RDI;
  int is_pressed_1;
  mfb_mouse_button button;
  int is_pressed;
  mfb_key key_code;
  int in_stack_ffffffffffffffcc;
  undefined8 in_stack_ffffffffffffffd0;
  
  switch(*in_RSI) {
  case 2:
  case 3:
    mVar3 = translate_key(in_RSI[0x15]);
    iVar2 = *in_RSI;
    uVar4 = translate_mod_ex((int)((ulong)in_stack_ffffffffffffffd0 >> 0x20),
                             (int)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
    in_RDI->mod_keys = uVar4;
    in_RDI->key_status[mVar3] = iVar2 == 2;
    if ((in_RDI != (SWindowData *)0x0) && (in_RDI->keyboard_func != (mfb_keyboard_func)0x0)) {
      (*in_RDI->keyboard_func)((mfb_window *)in_RDI,mVar3,in_RDI->mod_keys,iVar2 == 2);
    }
    break;
  case 4:
  case 5:
    mVar1 = in_RSI[0x15];
    iVar2 = *in_RSI;
    uVar4 = translate_mod(in_RSI[0x14]);
    in_RDI->mod_keys = uVar4;
    switch(mVar1) {
    case MOUSE_BTN_1:
    case MOUSE_BTN_2:
    case MOUSE_BTN_3:
      if ((in_RDI != (SWindowData *)0x0) && (in_RDI->mouse_btn_func != (mfb_mouse_button_func)0x0))
      {
        (*in_RDI->mouse_btn_func)((mfb_window *)in_RDI,mVar1,in_RDI->mod_keys,iVar2 == 4);
      }
      break;
    case MOUSE_BTN_4:
      if ((in_RDI != (SWindowData *)0x0) && (in_RDI->mouse_wheel_func != (mfb_mouse_scroll_func)0x0)
         ) {
        (*in_RDI->mouse_wheel_func)((mfb_window *)in_RDI,in_RDI->mod_keys,0.0,1.0);
      }
      break;
    case MOUSE_BTN_5:
      if ((in_RDI != (SWindowData *)0x0) && (in_RDI->mouse_wheel_func != (mfb_mouse_scroll_func)0x0)
         ) {
        (*in_RDI->mouse_wheel_func)((mfb_window *)in_RDI,in_RDI->mod_keys,0.0,-1.0);
      }
      break;
    case MOUSE_BTN_6:
      if ((in_RDI != (SWindowData *)0x0) && (in_RDI->mouse_wheel_func != (mfb_mouse_scroll_func)0x0)
         ) {
        (*in_RDI->mouse_wheel_func)((mfb_window *)in_RDI,in_RDI->mod_keys,1.0,0.0);
      }
      break;
    case MOUSE_BTN_7:
      if ((in_RDI != (SWindowData *)0x0) && (in_RDI->mouse_wheel_func != (mfb_mouse_scroll_func)0x0)
         ) {
        (*in_RDI->mouse_wheel_func)((mfb_window *)in_RDI,in_RDI->mod_keys,-1.0,0.0);
      }
      break;
    default:
      if ((in_RDI != (SWindowData *)0x0) && (in_RDI->mouse_btn_func != (mfb_mouse_button_func)0x0))
      {
        (*in_RDI->mouse_btn_func)
                  ((mfb_window *)in_RDI,mVar1 - MOUSE_BTN_4,in_RDI->mod_keys,iVar2 == 4);
      }
    }
    break;
  case 6:
    in_RDI->mouse_pos_x = in_RSI[0x10];
    in_RDI->mouse_pos_y = in_RSI[0x11];
    if ((in_RDI != (SWindowData *)0x0) && (in_RDI->mouse_move_func != (mfb_mouse_move_func)0x0)) {
      (*in_RDI->mouse_move_func)((mfb_window *)in_RDI,in_RSI[0x10],in_RSI[0x11]);
    }
    break;
  case 7:
  case 8:
    break;
  case 9:
    in_RDI->is_active = true;
    if ((in_RDI != (SWindowData *)0x0) && (in_RDI->active_func != (mfb_active_func)0x0)) {
      (*in_RDI->active_func)((mfb_window *)in_RDI,true);
    }
    break;
  case 10:
    in_RDI->is_active = false;
    if ((in_RDI != (SWindowData *)0x0) && (in_RDI->active_func != (mfb_active_func)0x0)) {
      (*in_RDI->active_func)((mfb_window *)in_RDI,false);
    }
    break;
  case 0x11:
    in_RDI->close = true;
    break;
  case 0x16:
    in_RDI->window_width = in_RSI[0xe];
    in_RDI->window_height = in_RSI[0xf];
    resize_dst(in_RDI,in_RSI[0xe],in_RSI[0xf]);
    resize_GL((SWindowData *)0x1044b3);
    if ((in_RDI != (SWindowData *)0x0) && (in_RDI->resize_func != (mfb_resize_func)0x0)) {
      (*in_RDI->resize_func)((mfb_window *)in_RDI,in_RDI->window_width,in_RDI->window_height);
    }
  }
  return;
}

Assistant:

static void 
processEvent(SWindowData *window_data, XEvent *event) {
    switch (event->type) {
        case KeyPress:
        case KeyRelease: 
        {
            mfb_key key_code      = (mfb_key) translate_key(event->xkey.keycode);
            int is_pressed        = (event->type == KeyPress);
            window_data->mod_keys = translate_mod_ex(key_code, event->xkey.state, is_pressed);

            window_data->key_status[key_code] = is_pressed;
            kCall(keyboard_func, key_code, (mfb_key_mod) window_data->mod_keys, is_pressed);
        }
        break;

        case ButtonPress:
        case ButtonRelease:
        {
            mfb_mouse_button button = (mfb_mouse_button) event->xbutton.button;
            int          is_pressed = (event->type == ButtonPress);
            window_data->mod_keys   = translate_mod(event->xkey.state);
            switch (button) {
                case Button1:
                case Button2:
                case Button3:
                    kCall(mouse_btn_func, button, (mfb_key_mod) window_data->mod_keys, is_pressed);
                    break;

                case Button4:
                    kCall(mouse_wheel_func, (mfb_key_mod) window_data->mod_keys, 0.0f, 1.0f);
                    break;
                case Button5:
                    kCall(mouse_wheel_func, (mfb_key_mod) window_data->mod_keys, 0.0f, -1.0f);
                    break;

                case 6:
                    kCall(mouse_wheel_func, (mfb_key_mod) window_data->mod_keys, 1.0f, 0.0f);
                    break;
                case 7:
                    kCall(mouse_wheel_func, (mfb_key_mod) window_data->mod_keys, -1.0f, 0.0f);
                    break;

                default:
                    kCall(mouse_btn_func, (mfb_mouse_button) (button - 4), (mfb_key_mod) window_data->mod_keys, is_pressed);
                    break;
            }
        }
        break;

        case MotionNotify:
            window_data->mouse_pos_x = event->xmotion.x;
            window_data->mouse_pos_y = event->xmotion.y;
            kCall(mouse_move_func, event->xmotion.x, event->xmotion.y);
            break;

        case ConfigureNotify: 
        {
            window_data->window_width  = event->xconfigure.width;
            window_data->window_height = event->xconfigure.height;            
            resize_dst(window_data, event->xconfigure.width, event->xconfigure.height);

#if defined(USE_OPENGL_API)
            resize_GL(window_data);
#else
            SWindowData_X11 *window_data_x11 = (SWindowData_X11 *) window_data->specific;
            if(window_data_x11->image_scaler != 0x0) {
                window_data_x11->image_scaler->data = 0x0;
                XDestroyImage(window_data_x11->image_scaler);
                window_data_x11->image_scaler        = 0x0;
                window_data_x11->image_scaler_width  = 0;
                window_data_x11->image_scaler_height = 0;
            }
            XClearWindow(window_data_x11->display, window_data_x11->window);
#endif                
            kCall(resize_func, window_data->window_width, window_data->window_height);
        }
        break;

        case EnterNotify:
        case LeaveNotify:
        break;

        case FocusIn:
            window_data->is_active = true;
            kCall(active_func, true);
            break;

        case FocusOut:
            window_data->is_active = false;
            kCall(active_func, false);
            break;

        case DestroyNotify:
            window_data->close = true;
            return;
            break;
    }
}